

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::ResetInlineCaches(FunctionBody *this)

{
  SetCountField(this,InlineCacheCount,0);
  SetCountField(this,RootObjectLoadInlineCacheStart,0);
  SetCountField(this,RootObjectStoreInlineCacheStart,0);
  SetCountField(this,IsInstInlineCacheCount,0);
  (this->inlineCaches).ptr = (void **)0x0;
  (this->polymorphicInlineCaches).inlineCaches.ptr =
       (WriteBarrierPtr<Js::PolymorphicInlineCache> *)0x0;
  (this->polymorphicInlineCaches).inlineCacheCount = 0;
  return;
}

Assistant:

void FunctionBody::ResetInlineCaches()
    {
        SetInlineCacheCount(0);
        SetRootObjectLoadInlineCacheStart(0);
        SetRootObjectStoreInlineCacheStart(0);
        SetIsInstInlineCacheCount(0);
        this->inlineCaches = nullptr;
        this->polymorphicInlineCaches.Reset();
    }